

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

int md_line_contains(MD_CTX *ctx,MD_OFFSET beg,MD_CHAR *what,MD_SIZE what_len,MD_OFFSET *p_end)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = ctx->size;
  do {
    iVar3 = 0;
    if (uVar2 <= what_len + beg) {
LAB_00531c1e:
      *p_end = beg;
      return iVar3;
    }
    cVar1 = ctx->text[beg];
    if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_00531c1e;
    iVar3 = bcmp(ctx->text + beg,what,(ulong)what_len);
    if (iVar3 == 0) {
      iVar3 = 1;
      beg = what_len + beg;
      goto LAB_00531c1e;
    }
    beg = beg + 1;
  } while( true );
}

Assistant:

static int
md_line_contains(MD_CTX* ctx, OFF beg, const CHAR* what, SZ what_len, OFF* p_end)
{
    OFF i;
    for(i = beg; i + what_len < ctx->size; i++) {
        if(ISNEWLINE(i))
            break;
        if(memcmp(STR(i), what, what_len * sizeof(CHAR)) == 0) {
            *p_end = i + what_len;
            return TRUE;
        }
    }

    *p_end = i;
    return FALSE;
}